

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::upToLast
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  size_t sVar3;
  int in_ECX;
  char *pcVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong extraout_RDX;
  VerySimpleReadOnlyString VVar6;
  
  uVar2 = reverseFind(find,(VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind),
                      0xffffffff);
  uVar1 = find->length;
  uVar5 = (ulong)uVar1;
  __s = find->data;
  pcVar4 = "";
  if (in_ECX == 0) {
    pcVar4 = __s;
  }
  if (uVar2 != uVar1) {
    pcVar4 = __s;
  }
  if (in_ECX == 0) {
LAB_00113263:
    this->data = __s;
    if (uVar2 != 0xffffffff) goto LAB_00113279;
    if (__s != (char *)0x0) {
      sVar3 = strlen(__s);
      uVar2 = (uint)sVar3;
      uVar5 = extraout_RDX;
      goto LAB_00113279;
    }
  }
  else {
    if (uVar2 != uVar1) {
      uVar2 = uVar2 + ((VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind))->
                      length;
      goto LAB_00113263;
    }
    this->data = pcVar4;
  }
  uVar2 = 0;
LAB_00113279:
  this->length = uVar2;
  VVar6._8_8_ = uVar5;
  VVar6.data = (tCharPtr)this;
  return VVar6;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::upToLast(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = reverseFind(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length && includeFind ? "" : data, includeFind ? (pos == (unsigned int)length ? 0 : pos + (unsigned int)find.length) : pos);
	}